

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void QWidget::setTabOrder(initializer_list<QWidget_*> widgets)

{
  long lVar1;
  const_iterator ppQVar2;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget **widget;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<QWidget_*> *__range1;
  QWidget *prev;
  initializer_list<QWidget_*> *in_stack_ffffffffffffffc0;
  const_iterator ppQVar3;
  const_iterator local_30;
  QWidget *second;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  second = (QWidget *)0x0;
  local_30 = std::initializer_list<QWidget_*>::begin
                       ((initializer_list<QWidget_*> *)&stack0xffffffffffffffe8);
  ppQVar2 = std::initializer_list<QWidget_*>::end(in_stack_ffffffffffffffc0);
  for (; local_30 != ppQVar2; local_30 = local_30 + 1) {
    if (second == (QWidget *)0x0) {
      second = *local_30;
    }
    else {
      ppQVar3 = local_30;
      setTabOrder(in_RDI,second);
      second = *ppQVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setTabOrder(std::initializer_list<QWidget *> widgets)
{
    QWidget *prev = nullptr;
    for (const auto &widget : widgets) {
        if (!prev) {
            prev = widget;
        } else {
            QWidget::setTabOrder(prev, widget);
            prev = widget;
        }
    }
}